

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

NameSyntax * __thiscall
slang::parsing::Parser::parseNamePart
          (Parser *this,bitmask<slang::parsing::detail::NameOptions> options)

{
  BumpAllocator *alloc;
  bool bVar1;
  SyntaxKind kind;
  uint uVar2;
  int iVar3;
  ParameterValueAssignmentSyntax *parameters;
  IdentifierSelectNameSyntax *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SourceLocation SVar5;
  undefined4 extraout_var_01;
  KeywordNameSyntax *pKVar6;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Info *src_01;
  Info *extraout_RDX;
  EVP_PKEY_CTX *ctx;
  Token TVar7;
  Token TVar8;
  Token local_c0;
  uint32_t index;
  SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> buffer;
  SyntaxList<slang::syntax::ElementSelectSyntax> local_68;
  
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  kind = slang::syntax::SyntaxFacts::getKeywordNameExpression(TVar7.kind);
  if (kind != Unknown) {
    bVar1 = slang::syntax::SyntaxFacts::isSpecialMethodName(kind);
    if (bVar1) {
      if ((options.m_bits & 2) != 0) goto LAB_002a4077;
    }
    else {
      if (kind == ConstructorName) {
        TVar8 = ParserBase::consume(&this->super_ParserBase);
        kind = ConstructorName;
        goto LAB_002a443a;
      }
      if ((options.m_bits & 2) == 0) {
        if (kind == ThisHandle) {
          uVar2 = options.m_bits & 8;
        }
        else {
          if (kind != SuperHandle) goto LAB_002a4077;
          uVar2 = options.m_bits & 0xc;
        }
        if (uVar2 == 0) goto LAB_002a4077;
      }
    }
    TVar8 = ParserBase::consume(&this->super_ParserBase);
LAB_002a443a:
    pKVar6 = slang::syntax::SyntaxFactory::keywordName(&this->factory,kind,TVar8);
    return &pKVar6->super_NameSyntax;
  }
LAB_002a4077:
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  Token::Token(&local_c0);
  if ((TVar7.kind != Dot) && (uVar2 = TVar7._0_4_ & 0xffff, uVar2 != 0x17)) {
    if (uVar2 == 2) {
      local_c0 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_002a4112;
    }
    if ((options.m_bits & 0x10) != 0) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>._0_16_ =
             ParserBase::peek(&this->super_ParserBase);
        SVar5 = Token::location((Token *)&buffer);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar5);
      }
      alloc = (this->super_ParserBase).alloc;
      buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      SVar5 = Token::location((Token *)&buffer);
      local_c0 = Token::createMissing(alloc,Identifier,SVar5);
      goto LAB_002a4112;
    }
  }
  local_c0 = ParserBase::expect(&this->super_ParserBase,Identifier);
LAB_002a4112:
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  if (TVar7.kind == OpenBracket) {
    buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.data_ =
         (pointer)buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.firstElement;
    if ((options.m_bits & 1) == 0) {
      buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.len = 0;
      buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.cap = 5;
      do {
        if (((options.m_bits & 0x20) != 0) &&
           (bVar1 = isSequenceRepetition(this), TVar8 = local_c0, bVar1)) {
          ctx = (EVP_PKEY_CTX *)local_c0._0_8_;
          if (buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.len == 0) {
            pIVar4 = (IdentifierSelectNameSyntax *)
                     slang::syntax::SyntaxFactory::identifierName(&this->factory,local_c0);
          }
          else {
            iVar3 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                              (&buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>,
                               (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
            local_68.super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr
                 = (pointer)CONCAT44(extraout_var_01,iVar3);
            local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
            local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
            local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
            local_68.super_SyntaxListBase._vptr_SyntaxListBase =
                 (_func_int **)&PTR_getChild_006a3f90;
            pIVar4 = slang::syntax::SyntaxFactory::identifierSelectName
                               (&this->factory,TVar8,&local_68);
          }
          goto LAB_002a446c;
        }
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)parseElementSelect(this);
        SmallVectorBase<slang::syntax::ElementSelectSyntax*>::
        emplace_back<slang::syntax::ElementSelectSyntax*>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax*> *)&buffer,
                   (ElementSelectSyntax **)&local_68);
        bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
        TVar8 = local_c0;
      } while (bVar1);
      ctx = (EVP_PKEY_CTX *)local_c0._0_8_;
      iVar3 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                        (&buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
      local_68.super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)CONCAT44(extraout_var,iVar3);
      local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3f90;
      pIVar4 = slang::syntax::SyntaxFactory::identifierSelectName(&this->factory,TVar8,&local_68);
    }
    else {
      buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.len = 0;
      buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.cap = 5;
      do {
        index = 1;
        scanTypePart<&slang::syntax::SyntaxFacts::isSemicolon>(this,&index,OpenBracket,CloseBracket)
        ;
        TVar7 = ParserBase::peek(&this->super_ParserBase,index);
        if (TVar7.kind != OpenBracket) {
          TVar7 = ParserBase::peek(&this->super_ParserBase,index);
          src_01 = TVar7.info;
          if (TVar7.kind != Dot) break;
        }
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)parseElementSelect(this);
        SmallVectorBase<slang::syntax::ElementSelectSyntax*>::
        emplace_back<slang::syntax::ElementSelectSyntax*>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax*> *)&buffer,
                   (ElementSelectSyntax **)&local_68);
        bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
        src_01 = extraout_RDX;
      } while (bVar1);
      TVar8 = local_c0;
      ctx = (EVP_PKEY_CTX *)local_c0._0_8_;
      if (buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>.len == 0) {
        pIVar4 = (IdentifierSelectNameSyntax *)
                 slang::syntax::SyntaxFactory::identifierName(&this->factory,local_c0);
      }
      else {
        iVar3 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                          (&buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src_01);
        local_68.super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr =
             (pointer)CONCAT44(extraout_var_00,iVar3);
        local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
        local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3f90;
        pIVar4 = slang::syntax::SyntaxFactory::identifierSelectName(&this->factory,TVar8,&local_68);
      }
    }
LAB_002a446c:
    SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::cleanup
              (&buffer.super_SmallVectorBase<slang::syntax::ElementSelectSyntax_*>,ctx);
  }
  else if ((TVar7.kind == Hash) && ((options.m_bits & 0x40) == 0)) {
    parameters = parseParameterValueAssignment(this);
    pIVar4 = (IdentifierSelectNameSyntax *)
             slang::syntax::SyntaxFactory::className(&this->factory,local_c0,parameters);
  }
  else {
    pIVar4 = (IdentifierSelectNameSyntax *)
             slang::syntax::SyntaxFactory::identifierName(&this->factory,local_c0);
  }
  return &pIVar4->super_NameSyntax;
}

Assistant:

NameSyntax& Parser::parseNamePart(bitmask<NameOptions> options) {
    auto kind = getKeywordNameExpression(peek().kind);
    if (kind != SyntaxKind::Unknown) {
        // This is a keyword name such as "super", "xor", or "new".
        bool isFirst = (options & NameOptions::IsFirst) != 0;
        if (isSpecialMethodName(kind)) {
            // The built-in methods ("xor", "unique", etc) and are not allowed
            // to be the first element in the name.
            if (!isFirst)
                return factory.keywordName(kind, consume());
        }
        else if (kind == SyntaxKind::ConstructorName) {
            // "new" names are always allowed.
            return factory.keywordName(kind, consume());
        }
        else {
            // Otherwise this is "$unit", "$root", "local", "this", "super".
            // These are only allowed to be the first element in a path, except
            // for "super" which can follow "this".
            if (isFirst ||
                (kind == SyntaxKind::SuperHandle && options.has(NameOptions::PreviousWasThis)) ||
                ((kind == SyntaxKind::SuperHandle || kind == SyntaxKind::ThisHandle) &&
                 options.has(NameOptions::PreviousWasLocal))) {
                return factory.keywordName(kind, consume());
            }
        }

        // Otherwise fall through to the handling below to get an error emitted.
    }

    TokenKind next = peek().kind;
    Token identifier;
    if (next == TokenKind::Identifier) {
        identifier = consume();
    }
    else if (next != TokenKind::Dot && next != TokenKind::DoubleColon &&
             options.has(NameOptions::ExpectingExpression)) {
        if (!haveDiagAtCurrentLoc())
            addDiag(diag::ExpectedExpression, peek().location());
        identifier = Token::createMissing(alloc, TokenKind::Identifier, peek().location());
    }
    else {
        identifier = expect(TokenKind::Identifier);
    }

    switch (peek().kind) {
        case TokenKind::Hash: {
            if (options.has(NameOptions::NoClassScope))
                return factory.identifierName(identifier);

            auto parameterValues = parseParameterValueAssignment();
            SLANG_ASSERT(parameterValues);
            return factory.className(identifier, *parameterValues);
        }
        case TokenKind::OpenBracket: {
            if (options.has(NameOptions::ForeachName)) {
                // For a foreach loop declaration, the final selector
                // brackets need to be parsed specially because they declare
                // loop variable names. All the selectors prior can be
                // parsed as normal selectors.
                SmallVector<ElementSelectSyntax*> buffer;
                do {
                    uint32_t index = 1;
                    scanTypePart<isSemicolon>(index, TokenKind::OpenBracket,
                                              TokenKind::CloseBracket);
                    if (peek(index).kind != TokenKind::OpenBracket &&
                        peek(index).kind != TokenKind::Dot) {
                        break;
                    }

                    buffer.push_back(&parseElementSelect());
                } while (peek(TokenKind::OpenBracket));

                if (buffer.empty())
                    return factory.identifierName(identifier);

                return factory.identifierSelectName(identifier, buffer.copy(alloc));
            }
            else {
                SmallVector<ElementSelectSyntax*> buffer;
                do {
                    // Inside a sequence expression this could be a repetition directive
                    // instead of a selection.
                    if (options.has(NameOptions::SequenceExpr) && isSequenceRepetition()) {
                        if (buffer.empty())
                            return factory.identifierName(identifier);
                        else
                            return factory.identifierSelectName(identifier, buffer.copy(alloc));
                    }

                    buffer.push_back(&parseElementSelect());
                } while (peek(TokenKind::OpenBracket));

                return factory.identifierSelectName(identifier, buffer.copy(alloc));
            }
        }
        default: {
            return factory.identifierName(identifier);
        }
    }
}